

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmTable.c
# Opt level: O2

Nm_Entry_t * Nm_ManTableLookupName(Nm_Man_t *p,char *pName,int Type)

{
  Nm_Entry_t *pNVar1;
  uint uVar2;
  int iVar3;
  Nm_Entry_t **ppNVar4;
  Nm_Entry_t *pNVar5;
  
  ppNVar4 = p->pBinsN2I;
  uVar2 = Nm_HashString(pName,p->nBins);
  ppNVar4 = ppNVar4 + uVar2;
  do {
    pNVar1 = *ppNVar4;
    if (pNVar1 == (Nm_Entry_t *)0x0) {
      return (Nm_Entry_t *)0x0;
    }
    iVar3 = strcmp((char *)(pNVar1 + 1),pName);
    if (iVar3 == 0) {
      if (Type == -1) {
        return pNVar1;
      }
      if (pNVar1->Type == Type) {
        return pNVar1;
      }
    }
    pNVar5 = pNVar1->pNameSake;
    if (pNVar5 != (Nm_Entry_t *)0x0) {
      for (; pNVar5 != pNVar1; pNVar5 = pNVar5->pNameSake) {
        iVar3 = strcmp((char *)(pNVar5 + 1),pName);
        if (iVar3 == 0) {
          if (Type == -1) {
            return pNVar5;
          }
          if (pNVar5->Type == Type) {
            return pNVar5;
          }
        }
      }
    }
    ppNVar4 = &pNVar1->pNextN2I;
  } while( true );
}

Assistant:

Nm_Entry_t * Nm_ManTableLookupName( Nm_Man_t * p, char * pName, int Type )
{
    Nm_Entry_t * pEntry, * pTemp;
    for ( pEntry = p->pBinsN2I[ Nm_HashString(pName, p->nBins) ]; pEntry; pEntry = pEntry->pNextN2I )
    {
        // check the entry itself
        if ( !strcmp(pEntry->Name, pName) && (Type == -1 || pEntry->Type == (unsigned)Type) )
            return pEntry;
        // if there is no namesakes, continue
        if ( pEntry->pNameSake == NULL )
            continue;
        // check the list of namesakes
        for ( pTemp = pEntry->pNameSake; pTemp != pEntry; pTemp = pTemp->pNameSake )
            if ( !strcmp(pTemp->Name, pName) && (Type == -1 || pTemp->Type == (unsigned)Type) )
                return pTemp;
    }
    return NULL;
}